

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O2

void exit_cb(uv_process_t *process,int64_t exit_status,int term_signal)

{
  char *pcVar1;
  undefined8 uStack_20;
  
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if (exit_status == 0) {
    if (term_signal == 0) {
      uv_close(process,close_cb);
      uv_close(&in,close_cb);
      uv_close(&out,close_cb);
      return;
    }
    pcVar1 = "term_signal == 0";
    uStack_20 = 0x38;
  }
  else {
    pcVar1 = "exit_status == 0";
    uStack_20 = 0x37;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
          ,uStack_20,pcVar1);
  abort();
}

Assistant:

static void exit_cb(uv_process_t* process,
                    int64_t exit_status,
                    int term_signal) {
  printf("exit_cb\n");
  exit_cb_called++;
  ASSERT(exit_status == 0);
  ASSERT(term_signal == 0);
  uv_close((uv_handle_t*)process, close_cb);
  uv_close((uv_handle_t*)&in, close_cb);
  uv_close((uv_handle_t*)&out, close_cb);
}